

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

size_type ot::commissioner::EndsWithAtPos(string *testString,string *subString)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_type local_20;
  size_type result;
  string *subString_local;
  string *testString_local;
  
  local_20 = 0xffffffffffffffff;
  result = (size_type)subString;
  subString_local = testString;
  uVar2 = std::__cxx11::string::length();
  uVar3 = std::__cxx11::string::length();
  if (uVar3 <= uVar2) {
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::length();
    local_20 = lVar4 - lVar5;
    std::__cxx11::string::substr((ulong)&local_40,(ulong)subString_local);
    bVar1 = std::operator!=(&local_40,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            result);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      local_20 = 0xffffffffffffffff;
    }
  }
  return local_20;
}

Assistant:

static std::string::size_type EndsWithAtPos(const std::string &testString, const std::string &subString)
{
    auto result = std::string::npos;
    ;

    if (testString.length() >= subString.length())
    {
        result = testString.length() - subString.length();
        if (testString.substr(result) != subString)
        {
            result = std::string::npos;
        }
    }
    return result;
}